

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ippu_helpers.cpp
# Opt level: O1

void n_e_s::core::PrintTo(PpuRegisters *r,ostream *os)

{
  byte bVar1;
  string_view fmt;
  format_args args;
  string local_2d8;
  uint local_2b8 [4];
  undefined4 local_2a8;
  uint local_298;
  undefined4 local_288;
  uint local_278;
  undefined4 local_268;
  uint local_258;
  undefined4 local_248;
  uint local_238;
  undefined4 local_228;
  uint local_218;
  undefined4 local_208;
  uint local_1f8;
  undefined4 local_1e8;
  uint local_1d8;
  undefined4 local_1c8;
  uint local_1b8;
  undefined4 local_1a8;
  undefined1 local_198;
  undefined4 local_188;
  undefined1 local_178;
  undefined4 local_168;
  uint local_158;
  undefined4 local_148;
  uint local_138;
  undefined4 local_128;
  uint local_118;
  undefined4 local_108;
  uint local_f8;
  undefined4 local_e8;
  uint local_d8;
  undefined4 local_c8;
  uint local_b8;
  undefined4 local_a8;
  uint local_98;
  undefined4 local_88;
  uint local_78;
  undefined4 local_68;
  uint local_58;
  undefined4 local_48;
  
  bVar1 = (r->ctrl).value_;
  local_198 = r->write_toggle;
  local_178 = r->odd_frame;
  local_118 = (uint)r->pattern_table_shifter_hi;
  local_f8 = (uint)r->pattern_table_latch_hi;
  local_d8 = (uint)r->pattern_table_shifter_low;
  local_b8 = (uint)r->pattern_table_latch_low;
  local_98 = (uint)r->attribute_table_shifter_low;
  local_78 = (uint)r->attribute_table_shifter_hi;
  local_2b8[0] = (uint)r->cycle;
  local_2a8 = 2;
  local_298 = (uint)r->scanline;
  local_288 = 2;
  local_278 = (uint)bVar1;
  local_268 = 2;
  local_258 = (uint)r->fine_x_scroll;
  local_248 = 2;
  local_238 = (uint)(r->mask).super_Register<unsigned_char>.value_;
  local_228 = 2;
  local_218 = (uint)r->oamaddr;
  local_208 = 2;
  local_1f8 = (uint)(r->status).value_;
  local_1e8 = 2;
  local_1d8 = (uint)(r->vram_addr).super_Register<unsigned_short>.value_;
  local_1c8 = 2;
  local_1b8 = (uint)(r->temp_vram_addr).super_Register<unsigned_short>.value_;
  local_1a8 = 2;
  local_188 = 7;
  local_168 = 7;
  local_158 = (uint)r->name_table;
  local_148 = 2;
  local_138 = (uint)r->name_table_latch;
  local_128 = 2;
  local_108 = 2;
  local_e8 = 2;
  local_c8 = 2;
  local_a8 = 2;
  local_88 = 2;
  local_68 = 2;
  local_58 = (uint)r->attribute_table_latch;
  local_48 = 2;
  fmt.size_ = 0x8000000000000014;
  fmt.data_ = (char *)0x121;
  args.field_1._0_1_ = bVar1;
  args.desc_ = (unsigned_long_long)local_2b8;
  args.field_1._1_7_ = 0;
  ::fmt::v8::vformat_abi_cxx11_
            (&local_2d8,
             (v8 *)
             "Cycle: {} Scanline: {} Ctrl: {:#04x} ScrollX: {:#04x} Mask: {:#04x} OamAddr: {:#04x} Status: {:#04x} VramAddr: {:#06x} TmpVramAddr: {:#06x} WriteToggle: {} OddFrame: {} NameTbl: {:#04x}[{:#04x}] PatternTblHi: {:#06x}[{:#04x}] PatternTblLow: {:#06x}[{:#04x}] Attr: {:#06x}:{:#06x}[{:#04x}]\n"
             ,fmt,args);
  std::__ostream_insert<char,std::char_traits<char>>
            (os,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void PrintTo(const PpuRegisters &r, std::ostream *os) {
    *os << fmt::format(
            "Cycle: {} Scanline: {} Ctrl: {:#04x} ScrollX: {:#04x} Mask: "
            "{:#04x} OamAddr: {:#04x} "
            "Status: {:#04x} VramAddr: {:#06x} TmpVramAddr: {:#06x} "
            "WriteToggle: {} OddFrame: {} NameTbl: {:#04x}[{:#04x}] "
            "PatternTblHi: {:#06x}[{:#04x}] "
            "PatternTblLow: {:#06x}[{:#04x}] "
            "Attr: {:#06x}:{:#06x}[{:#04x}]\n",
            r.cycle,
            r.scanline,
            r.ctrl.value(),
            r.fine_x_scroll,
            r.mask.value(),
            r.oamaddr,
            r.status.value(),
            r.vram_addr.value(),
            r.temp_vram_addr.value(),
            r.write_toggle,
            r.odd_frame,
            r.name_table,
            r.name_table_latch,
            r.pattern_table_shifter_hi,
            r.pattern_table_latch_hi,
            r.pattern_table_shifter_low,
            r.pattern_table_latch_low,
            r.attribute_table_shifter_low,
            r.attribute_table_shifter_hi,
            r.attribute_table_latch);
}